

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::
sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **a,
          function<bool_(const_libtorrent::torrent_status_&)> *a_1,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a_2)

{
  bool bVar1;
  element_type *peVar2;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R9;
  undefined1 auVar3 [12];
  undefined1 local_e0 [8];
  undefined1 local_d8 [48];
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *local_a8;
  function<bool_(const_libtorrent::torrent_status_&)> local_a0;
  undefined4 local_80;
  exception_ptr local_78;
  exception_ptr ex;
  bool done;
  error_code_enum local_5c;
  undefined1 local_58 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a_local_2;
  function<bool_(const_libtorrent::torrent_status_&)> *a_local_1;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_R9;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_58);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
  if (!bVar1) {
    local_5c = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_5c);
  }
  ex._M_exception_object._3_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
  ctx = libtorrent::aux::session_impl::get_context(peVar2);
  local_d8._0_8_ = (long)&ex._M_exception_object + 3;
  local_d8._8_8_ = &local_78;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)(local_d8 + 0x10),
             (shared_ptr<libtorrent::aux::session_impl> *)local_58);
  local_a8 = *(vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **)
              &(a_1->super__Function_base)._M_functor;
  local_d8._32_8_ = f;
  local_d8._40_8_ = a;
  ::std::function<bool_(const_libtorrent::torrent_status_&)>::function
            (&local_a0,(function<bool_(const_libtorrent::torrent_status_&)> *)a_2);
  local_80 = *(undefined4 *)
              &(s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>(void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*&&,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type_conflict *)local_d8,(type *)0x0);
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_d8);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_58);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 3),peVar2);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
    ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
              ((shared_ptr<libtorrent::aux::session_impl> *)local_58);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_e0,&local_78);
  auVar3 = ::std::rethrow_exception((exception_ptr)local_e0);
  ex._M_exception_object._4_4_ = auVar3._8_4_;
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)(local_d8 + 0x10));
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_58);
  _Unwind_Resume(auVar3._0_8_);
}

Assistant:

void session_handle::sync_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;

		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
	}